

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall
kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
          (BufferedInputStreamWrapper *this,InputStream *inner,ArrayPtr<unsigned_char> buffer)

{
  uchar *puVar1;
  size_t sVar2;
  
  sVar2 = buffer.size_;
  puVar1 = buffer.ptr;
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__BufferedInputStreamWrapper_0037e758;
  this->inner = inner;
  if (sVar2 == 0) {
    sVar2 = 0x2000;
    puVar1 = (uchar *)_::HeapArrayDisposer::allocateImpl
                                (1,0x2000,0x2000,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
    (this->ownedBuffer).ptr = puVar1;
    (this->ownedBuffer).size_ = 0x2000;
    (this->ownedBuffer).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  }
  else {
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    (this->ownedBuffer).disposer = (ArrayDisposer *)0x0;
  }
  (this->buffer).ptr = puVar1;
  (this->buffer).size_ = sVar2;
  (this->bufferAvailable).ptr = (uchar *)0x0;
  (this->bufferAvailable).size_ = 0;
  return;
}

Assistant:

BufferedInputStreamWrapper::BufferedInputStreamWrapper(InputStream& inner, ArrayPtr<byte> buffer)
    : inner(inner), ownedBuffer(buffer == nullptr ? heapArray<byte>(8192) : nullptr),
      buffer(buffer == nullptr ? ownedBuffer : buffer) {}